

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_bool nk_menu_begin_image(nk_context *ctx,char *id,nk_image img,nk_vec2 size)

{
  nk_window *win;
  nk_widget_layout_states nVar1;
  nk_bool nVar2;
  int iVar3;
  nk_context *in;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  nk_rect bounds;
  nk_rect header_00;
  nk_rect header;
  nk_rect local_58;
  float local_48;
  float fStack_44;
  undefined8 uStack_40;
  nk_rect local_38;
  undefined1 local_28 [16];
  
  nVar1 = NK_WIDGET_INVALID;
  if (((ctx != (nk_context *)0x0) &&
      (win = ctx->current, nVar1 = NK_WIDGET_INVALID, win != (nk_window *)0x0)) &&
     (win->layout != (nk_panel *)0x0)) {
    local_28._8_4_ = in_XMM0_Dc;
    local_28._0_8_ = size;
    local_28._12_4_ = in_XMM0_Dd;
    nVar1 = nk_widget(&local_58,ctx);
    if (nVar1 != NK_WIDGET_INVALID) {
      if (nVar1 == NK_WIDGET_ROM) {
        in = (nk_context *)0x0;
      }
      else {
        in = (nk_context *)0x0;
        if ((win->layout->flags & 0x1000) == 0) {
          in = ctx;
        }
      }
      local_38.x = local_58.x;
      local_38.y = local_58.y;
      local_38.w = 0.0;
      local_38.h = 0.0;
      local_48 = local_58.w;
      fStack_44 = local_58.h;
      uStack_40 = 0;
      bounds.w = local_58.w;
      bounds.h = local_58.h;
      bounds.x = local_58.x;
      bounds.y = local_58.y;
      nVar2 = nk_do_button_image(&ctx->last_widget_state,&win->buffer,bounds,img,NK_BUTTON_DEFAULT,
                                 &(ctx->style).menu_button,&in->input);
      header_00.w = local_48;
      header_00.h = fStack_44;
      header_00.x = local_38.x;
      header_00.y = local_38.y;
      iVar3 = nk_menu_begin(ctx,win,id,(uint)(nVar2 != 0),header_00,(nk_vec2)local_28._0_8_);
      return iVar3;
    }
  }
  return nVar1;
}

Assistant:

NK_API nk_bool
nk_menu_begin_image(struct nk_context *ctx, const char *id, struct nk_image img,
struct nk_vec2 size)
{
struct nk_window *win;
struct nk_rect header;
const struct nk_input *in;
int is_clicked = nk_false;
nk_flags state;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return 0;

win = ctx->current;
state = nk_widget(&header, ctx);
if (!state) return 0;
in = (state == NK_WIDGET_ROM || win->layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
if (nk_do_button_image(&ctx->last_widget_state, &win->buffer, header,
img, NK_BUTTON_DEFAULT, &ctx->style.menu_button, in))
is_clicked = nk_true;
return nk_menu_begin(ctx, win, id, is_clicked, header, size);
}